

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::
basic_json_reader<wchar_t,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>,std::allocator<char>>
::
basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
          (basic_json_reader<wchar_t,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>,std::allocator<char>>
           *this,iterator_source<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *source,basic_json_visitor<wchar_t> *visitor,
          basic_json_decode_options<wchar_t> *options,allocator<char> *temp_alloc)

{
  _Any_data local_50;
  _Manager_type local_40;
  
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             &options->err_handler_);
  basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
            (this,source,visitor,options,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             temp_alloc);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

basic_json_reader(Sourceable&& source, 
                          basic_json_visitor<CharT>& visitor,
                          const basic_json_decode_options<CharT>& options, 
                          const TempAllocator& temp_alloc = TempAllocator())
            : basic_json_reader(std::forward<Sourceable>(source),
                                visitor,
                                options,
                                options.err_handler(),
                                temp_alloc)
        {
        }